

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O1

int32 nextline_str2words(FILE *fp,int32 *lineno,char **lineptr,char ***wordptr)

{
  bool bVar1;
  int32 max_ptr;
  char *line;
  char **ptr;
  size_t len;
  int32 local_44;
  size_t local_38;
  
  do {
    ckd_free(*lineptr);
    line = fread_line(fp,&local_38);
    *lineptr = line;
    bVar1 = true;
    if (line == (char *)0x0) {
      local_44 = -1;
    }
    else {
      *lineno = *lineno + 1;
      if (*line == '#') {
        bVar1 = false;
      }
      else {
        max_ptr = str2words(line,(char **)0x0,0);
        if (max_ptr == 0) {
          bVar1 = false;
        }
        else {
          if (*wordptr == (char **)0x0) {
            ptr = (char **)__ckd_calloc__((long)max_ptr,8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                          ,0x55);
          }
          else {
            ptr = (char **)__ckd_realloc__(*wordptr,(long)max_ptr << 3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                           ,0x57);
          }
          *wordptr = ptr;
          local_44 = str2words(*lineptr,ptr,max_ptr);
        }
      }
    }
  } while (!bVar1);
  return local_44;
}

Assistant:

static int32
nextline_str2words(FILE * fp, int32 * lineno,
                   char **lineptr, char ***wordptr)
{
    for (;;) {
        size_t len;
        int32 n;

        ckd_free(*lineptr);
        if ((*lineptr = fread_line(fp, &len)) == NULL)
            return -1;

        (*lineno)++;

        if ((*lineptr)[0] == FSG_MODEL_COMMENT_CHAR)
            continue;           /* Skip comment lines */

        n = str2words(*lineptr, NULL, 0);
        if (n == 0)
            continue;           /* Skip blank lines */

        /* Abuse of realloc(), but this doesn't have to be fast. */
        if (*wordptr == NULL)
            *wordptr = ckd_calloc(n, sizeof(**wordptr));
        else
            *wordptr = ckd_realloc(*wordptr, n * sizeof(**wordptr));
        return str2words(*lineptr, *wordptr, n);
    }
}